

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomdpx.cpp
# Opt level: O3

void __thiscall despot::POMDPX::InitTransitions(POMDPX *this)

{
  pointer pvVar1;
  pointer ppVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  log_ostream *plVar6;
  ostream *poVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  double dVar11;
  vector<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
  best;
  vector<int,_std::allocator<int>_> state;
  timeval tv;
  vector<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
  local_b0;
  double local_98;
  ulong local_90;
  size_type local_88;
  ulong local_80;
  ulong local_78;
  long local_70;
  vector<int,_std::allocator<int>_> local_68;
  State local_50;
  
  if (this->is_small_ != false) {
    gettimeofday((timeval *)&local_50,(__timezone_ptr_t)0x0);
    local_98 = (double)(long)local_50._vptr_State;
    dVar11 = (double)(long)local_50._8_8_;
    uVar3 = (*(this->super_MDP)._vptr_MDP[2])(this);
    uVar4 = (*(this->super_MDP)._vptr_MDP[3])(this);
    std::
    vector<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
    ::resize(&this->transition_probabilities_,(long)(int)uVar3);
    if (0 < (int)uVar3) {
      local_88 = (size_type)(int)uVar4;
      local_90 = (ulong)uVar3;
      local_78 = (ulong)uVar4;
      uVar10 = 0;
      do {
        Parser::ComputeState(&local_68,this->parser_,(int)uVar10);
        local_70 = uVar10 * 3;
        local_80 = uVar10;
        std::
        vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
        ::resize((this->transition_probabilities_).
                 super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar10,local_88);
        if (0 < (int)uVar4) {
          uVar10 = 0;
          do {
            Parser::ComputeTopTransitions
                      (&local_b0,this->parser_,&local_68,(ACT_TYPE)uVar10,
                       (int)(500000 / (ulong)uVar3));
            if (local_b0.
                super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                local_b0.
                super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              lVar9 = 0;
              uVar8 = 0;
              do {
                ppVar2 = local_b0.
                         super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                pvVar1 = (&(((this->transition_probabilities_).
                             super__Vector_base<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)[local_70];
                iVar5 = Parser::ComputeIndex
                                  (this->parser_,
                                   (vector<int,_std::allocator<int>_> *)
                                   ((long)&((local_b0.
                                             super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->first).
                                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                           super__Vector_impl_data._M_start + lVar9));
                State::State(&local_50,iVar5,*(double *)((long)&ppVar2->second + lVar9));
                std::vector<despot::State,_std::allocator<despot::State>_>::
                emplace_back<despot::State>(pvVar1 + uVar10,&local_50);
                State::~State(&local_50);
                uVar8 = uVar8 + 1;
                lVar9 = lVar9 + 0x20;
              } while (uVar8 < (ulong)((long)local_b0.
                                             super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)local_b0.
                                             super__Vector_base<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start >> 5));
            }
            std::
            vector<std::pair<std::vector<int,_std::allocator<int>_>,_double>,_std::allocator<std::pair<std::vector<int,_std::allocator<int>_>,_double>_>_>
            ::~vector(&local_b0);
            uVar10 = uVar10 + 1;
          } while (uVar10 != local_78);
        }
        if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        uVar10 = local_80 + 1;
      } while (uVar10 != local_90);
    }
    iVar5 = logging::level();
    if (0 < iVar5) {
      iVar5 = logging::level();
      if (2 < iVar5) {
        dVar11 = dVar11 / 1000000.0 + local_98;
        plVar6 = logging::stream(3);
        std::__ostream_insert<char,std::char_traits<char>>
                  (&plVar6->super_ostream,
                   "[POMDPX::InitTransitions] Initialized transition table in ",0x3a);
        gettimeofday((timeval *)&local_50,(__timezone_ptr_t)0x0);
        poVar7 = std::ostream::_M_insert<double>
                           (((double)(long)local_50._8_8_ / 1000000.0 +
                            (double)(long)local_50._vptr_State) - dVar11);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"s.",2);
        std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
      }
    }
    return;
  }
  __assert_fail("is_small_",
                "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/pomdpx/pomdpx.cpp"
                ,0x139,"void despot::POMDPX::InitTransitions()");
}

Assistant:

void POMDPX::InitTransitions() {
	assert(is_small_);

	double start = get_time_second();
	int num_states = NumStates(), num_actions = NumActions();
	transition_probabilities_.resize(num_states);
	for (int s = 0; s < num_states; s++) {
		vector<int> state = parser_->ComputeState(s);
		transition_probabilities_[s].resize(num_actions);
		for (int a = 0; a < num_actions; a++) {
			vector<pair<vector<int>, double> > best =
				parser_->ComputeTopTransitions(state, a, 500000 / num_states);
			for (int i = 0; i < best.size(); i++) {
				const pair<vector<int>, double>& pair = best[i];
				transition_probabilities_[s][a].push_back(
					State(parser_->ComputeIndex(pair.first), pair.second));
			}
		}
	}
	logi << "[POMDPX::InitTransitions] Initialized transition table in "
		<< (get_time_second() - start) << "s." << endl;
}